

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwSetWindowIcon(GLFWwindow *handle,int count,GLFWimage *images)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  ulong uVar4;
  long *__ptr;
  long *plVar5;
  uint uVar6;
  _GLFWwindow *window;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (count == 0) {
    (*_glfw.x11.xlib.DeleteProperty)
              (_glfw.x11.display,*(Window *)(handle + 0x348),_glfw.x11.NET_WM_ICON);
  }
  else {
    uVar4 = 0;
    uVar9 = (ulong)(uint)count;
    if (count < 1) {
      uVar9 = uVar4;
    }
    iVar8 = 0;
    for (; uVar9 << 4 != uVar4; uVar4 = uVar4 + 0x10) {
      iVar8 = iVar8 + *(int *)((long)&images->height + uVar4) *
                      *(int *)((long)&images->width + uVar4) + 2;
    }
    __ptr = (long *)calloc((long)iVar8,8);
    plVar5 = __ptr;
    for (uVar4 = 0; uVar4 != uVar9; uVar4 = uVar4 + 1) {
      iVar1 = images[uVar4].width;
      *plVar5 = (long)iVar1;
      iVar2 = images[uVar4].height;
      plVar5[1] = (long)iVar2;
      plVar5 = plVar5 + 2;
      uVar6 = iVar2 * iVar1;
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        puVar3 = images[uVar4].pixels;
        *plVar5 = (long)(int)((uint)puVar3[uVar7 * 4 + 3] << 0x18 |
                             (uint)puVar3[uVar7 * 4 + 2] |
                             (uint)puVar3[uVar7 * 4 + 1] << 8 | (uint)puVar3[uVar7 * 4] << 0x10);
        plVar5 = plVar5 + 1;
      }
    }
    (*_glfw.x11.xlib.ChangeProperty)
              (_glfw.x11.display,*(Window *)(handle + 0x348),_glfw.x11.NET_WM_ICON,6,0x20,0,
               (uchar *)__ptr,iVar8);
    free(__ptr);
  }
  (*_glfw.x11.xlib.Flush)(_glfw.x11.display);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowIcon(GLFWwindow* handle,
                               int count, const GLFWimage* images)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(count >= 0);
    assert(count == 0 || images != NULL);

    _GLFW_REQUIRE_INIT();
    _glfwPlatformSetWindowIcon(window, count, images);
}